

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledOutputFile.cpp
# Opt level: O3

int __thiscall Imf_2_5::TiledOutputFile::numXTiles(TiledOutputFile *this,int lx)

{
  char *pcVar1;
  ostream *poVar2;
  LogicExc *this_00;
  stringstream _iex_throw_s;
  stringstream asStack_198 [16];
  ostream local_188 [376];
  
  if ((-1 < lx) && (lx < this->_data->numXLevels)) {
    return this->_data->numXTiles[(uint)lx];
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream(asStack_198);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_188,"Error calling numXTiles() on image file \"",0x29);
  pcVar1 = OStream::fileName(this->_streamData->os);
  poVar2 = std::operator<<(local_188,pcVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"\" (Argument is not in valid range).",0x23);
  this_00 = (LogicExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::LogicExc::LogicExc(this_00,(stringstream *)asStack_198);
  __cxa_throw(this_00,&Iex_2_5::LogicExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
}

Assistant:

int
TiledOutputFile::numXTiles (int lx) const
{
    if (lx < 0 || lx >= _data->numXLevels)
	THROW (IEX_NAMESPACE::LogicExc, "Error calling numXTiles() on image "
			      "file \"" << _streamData->os->fileName() << "\" "
			      "(Argument is not in valid range).");

    return _data->numXTiles[lx];
}